

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting
          (OptionInterpreter *this,UninterpretedOption *uninterpreted_option,Message *options)

{
  Descriptor *this_00;
  FieldDescriptor *pFVar1;
  Message *pMVar2;
  undefined8 in_RSI;
  FieldDescriptor *field;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  LogMessage *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  LogLevel_conflict level;
  string *in_stack_ffffffffffffff50;
  allocator *factory;
  undefined7 in_stack_ffffffffffffff68;
  byte bVar3;
  Message *in_stack_ffffffffffffff70;
  Reflection *in_stack_ffffffffffffff78;
  allocator local_41;
  string local_40 [32];
  FieldDescriptor *local_20;
  undefined8 local_10;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_10 = in_RSI;
  this_00 = Message::GetDescriptor((Message *)in_stack_ffffffffffffff40);
  factory = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"uninterpreted_option",factory);
  pFVar1 = Descriptor::FindFieldByName(this_00,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  bVar3 = 0;
  local_20 = pFVar1;
  if (pFVar1 == (FieldDescriptor *)0x0) {
    in_stack_ffffffffffffff40 = (LogMessage *)&stack0xffffffffffffff70;
    internal::LogMessage::LogMessage
              ((LogMessage *)0x0,level,(char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    bVar3 = 1;
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff40,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  if ((bVar3 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x4cf326);
  }
  Message::GetReflection((Message *)in_stack_ffffffffffffff40);
  pMVar2 = Reflection::AddMessage
                     (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                      (FieldDescriptor *)CONCAT17(bVar3,in_stack_ffffffffffffff68),
                      (MessageFactory *)factory);
  (*(pMVar2->super_MessageLite)._vptr_MessageLite[0x10])(pMVar2,local_10);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting(
    const UninterpretedOption& uninterpreted_option, Message* options) {
  const FieldDescriptor* field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(field != nullptr);

  options->GetReflection()
      ->AddMessage(options, field)
      ->CopyFrom(uninterpreted_option);
}